

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O3

ScalarType
mt::angle<mt::Vector3<mt::Dual<float>>>(Vector3<mt::Dual<float>_> *v1,Vector3<mt::Dual<float>_> *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  RT x;
  float fVar13;
  ScalarType SVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  
  fVar1 = (v1->x).mReal;
  fVar2 = (v1->y).mReal;
  fVar3 = (v2->x).mReal;
  fVar4 = (v2->y).mReal;
  fVar5 = (v1->z).mReal;
  fVar6 = (v2->z).mReal;
  fVar17 = fVar6 * fVar6 + fVar4 * fVar4 + fVar3 * fVar3;
  fVar18 = fVar5 * fVar5 + fVar2 * fVar2 + fVar1 * fVar1;
  auVar16._0_4_ = fVar17 * fVar18;
  auVar16._4_4_ = fVar18;
  auVar16._8_8_ = 0;
  if (0.0 < auVar16._0_4_) {
    fVar7 = (v2->x).mDual;
    fVar8 = (v2->y).mDual;
    fVar9 = (v2->z).mDual;
    fVar19 = fVar7 * fVar3 + fVar8 * fVar4 + fVar9 * fVar6;
    fVar10 = (v1->y).mDual;
    fVar11 = (v1->z).mDual;
    fVar12 = (v1->x).mDual;
    auVar20 = rsqrtss(ZEXT816(0),auVar16);
    fVar15 = auVar20._0_4_;
    fVar13 = (auVar16._0_4_ * fVar15 * fVar15 + -3.0) * fVar15 * -0.5;
    fVar21 = fVar5 * fVar6 + fVar2 * fVar4 + fVar1 * fVar3;
    fVar22 = fVar21 * fVar13;
    fVar15 = fVar22;
    if (1.0 <= fVar22) {
      fVar15 = 1.0;
    }
    SVar14.mReal = acosf((float)(-(uint)(fVar22 < -1.0) & 0xbf800000 |
                                ~-(uint)(fVar22 < -1.0) & (uint)fVar15));
    fVar22 = 1.0 - fVar22 * fVar22;
    auVar16 = rsqrtss(ZEXT416(0),ZEXT416((uint)fVar22));
    fVar15 = auVar16._0_4_;
    SVar14.mDual = fVar15 * -0.5 *
                   (fVar13 * fVar21 * fVar13 * fVar13 * 0.5 *
                    (fVar17 * (fVar5 * fVar11 + fVar2 * fVar10 + fVar1 * fVar12) * 2.0 +
                    (fVar19 + fVar19) * fVar18) -
                   fVar13 * (fVar3 * fVar12 + fVar1 * fVar7 + fVar5 * fVar9 + fVar2 * fVar8 +
                            fVar6 * fVar11 + fVar4 * fVar10)) * (fVar22 * fVar15 * fVar15 + -3.0);
    return SVar14;
  }
  __assert_fail("ispositive(a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/erwincoumans[P]motion-toolkit/moto/Scalar.hpp"
                ,0x112,"Scalar mt::rsqrt(Scalar) [Scalar = mt::Dual<float>]");
}

Assistant:

typename Vector::ScalarType angle(const Vector& v1, const Vector& v2)
    {
        return acos(dot(v1, v2) * rsqrt(lengthSquared(v1) * lengthSquared(v2)));
    }